

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O0

void renderer_COMPACT_RESIST_RENDERER_WITH_COMBINED_AUX
               (wchar_t *label,wchar_t nlabel,wchar_t *vals,wchar_t *auxvals,wchar_t n,
               ui_entry_details *details,renderer_info *info)

{
  wchar_t wVar1;
  wchar_t wVar2;
  int iVar3;
  wchar_t timed_effect_1;
  wchar_t untimed_effect_1;
  wchar_t palette_index_1;
  wchar_t combined_label_tbl [7] [7];
  wchar_t palette_index;
  wchar_t timed_effect;
  wchar_t untimed_effect;
  wchar_t i;
  wchar_t ac;
  wchar_t vc;
  ui_entry_combiner_funcs_conflict combiner;
  wchar_t wStack_110;
  wchar_t color_offset;
  loc_conflict p;
  wchar_t combined_effect_tbl [7] [7];
  ui_entry_details *details_local;
  wchar_t n_local;
  wchar_t *auxvals_local;
  wchar_t *vals_local;
  wchar_t nlabel_local;
  wchar_t *label_local;
  
  memcpy(&p,&DAT_00309db0,0xc4);
  _wStack_110 = details->value_position;
  combiner.vec_func._4_4_ = 0;
  if ((details->alternate_color_first & 1U) != 0) {
    combiner.vec_func._4_4_ = 0x16;
  }
  if (((L'+' < info->ncolors) && (L'\f' < info->nlabcolors)) && (L'\x15' < info->nsym)) {
    timed_effect = L'\0';
    while( true ) {
      if (n <= timed_effect) {
        if ((L'\0' < nlabel) || ((details->show_combined & 1U) != 0)) {
          iVar3 = ui_entry_combiner_get_funcs(info->combiner_index,(ui_entry_combiner_funcs *)&ac);
          if (iVar3 != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/ui-entry-renderers.c"
                          ,0x259,
                          "void renderer_COMPACT_RESIST_RENDERER_WITH_COMBINED_AUX(const wchar_t *, int, const int *, const int *, int, const struct ui_entry_details *, const struct renderer_info *)"
                         );
          }
          (*combiner.finish_func)((ui_entry_combiner_state_conflict *)n);
          if (L'\0' < nlabel) {
            memcpy(&untimed_effect_1,&DAT_00309e80,0xc4);
            if ((details->known_rune & 1U) == 0) {
              timed_effect_1 = L'\0';
            }
            else {
              wVar1 = convert_vanilla_res_level(i);
              wVar2 = convert_vanilla_res_level(untimed_effect);
              if (((wVar1 < L'\0') || (L'\x06' < wVar1)) || ((wVar2 < L'\0' || (L'\x06' < wVar2))))
              {
                __assert_fail("untimed_effect >= 0 && untimed_effect < 7 && timed_effect >= 0 && timed_effect < 7"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/ui-entry-renderers.c"
                              ,0x275,
                              "void renderer_COMPACT_RESIST_RENDERER_WITH_COMBINED_AUX(const wchar_t *, int, const int *, const int *, int, const struct ui_entry_details *, const struct renderer_info *)"
                             );
              }
              timed_effect_1 = (&untimed_effect_1)[(long)wVar1 * 7 + (long)wVar2];
            }
            if ((details->vertical_label & 1U) == 0) {
              safe_queue_chars((details->label_position).x,(details->label_position).y,nlabel,
                               info->label_colors[timed_effect_1],label);
            }
            else {
              _wStack_110 = details->label_position;
              for (timed_effect = L'\0'; timed_effect < nlabel;
                  timed_effect = timed_effect + L'\x01') {
                Term_putch(wStack_110,color_offset,info->label_colors[timed_effect_1],
                           label[timed_effect]);
                color_offset = color_offset + L'\x01';
              }
            }
          }
          if ((details->show_combined & 1U) != 0) {
            show_combined_generic(info,details,i,untimed_effect);
          }
        }
        return;
      }
      wVar1 = convert_vanilla_res_level(vals[timed_effect]);
      wVar2 = convert_vanilla_res_level(auxvals[timed_effect]);
      if ((((wVar1 < L'\0') || (L'\x06' < wVar1)) || (wVar2 < L'\0')) || (L'\x06' < wVar2)) break;
      Term_putch(wStack_110,color_offset,
                 info->colors
                 [combined_effect_tbl[(long)wVar1 + -1][(long)wVar2 + 5] + combiner.vec_func._4_4_],
                 info->symbols[combined_effect_tbl[(long)wVar1 + -1][(long)wVar2 + 5]]);
      _wStack_110 = (loc_conflict)loc_sum((loc)_wStack_110,(loc)details->position_step);
      combiner.vec_func._4_4_ = combiner.vec_func._4_4_ ^ 0x16;
      timed_effect = timed_effect + L'\x01';
    }
    __assert_fail("untimed_effect >= 0 && untimed_effect < 7 && timed_effect >= 0 && timed_effect < 7"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/ui-entry-renderers.c"
                  ,0x24a,
                  "void renderer_COMPACT_RESIST_RENDERER_WITH_COMBINED_AUX(const wchar_t *, int, const int *, const int *, int, const struct ui_entry_details *, const struct renderer_info *)"
                 );
  }
  __assert_fail("info->ncolors >= 44 && info->nlabcolors >= 13 && info->nsym >= 22",
                "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/ui-entry-renderers.c"
                ,0x242,
                "void renderer_COMPACT_RESIST_RENDERER_WITH_COMBINED_AUX(const wchar_t *, int, const int *, const int *, int, const struct ui_entry_details *, const struct renderer_info *)"
               );
}

Assistant:

static void renderer_COMPACT_RESIST_RENDERER_WITH_COMBINED_AUX(
	const wchar_t *label,
	int nlabel,
	const int *vals,
	const int *auxvals,
	int n,
	const struct ui_entry_details *details,
	const struct renderer_info *info)
{
	/*
	 * Fastest varying is no timed effect, timed resistance,
	 * timed vulnerability, timed immunity, unknown timed effect,
	 * no value for timed effect, timed resistance + timed vulnerability
	 */
	const int combined_effect_tbl[7][7] = {
		/* No permanent effect */
		{  2,  6,  9, 11,  2,  2, 18 },
		/* Permanent resistance */
		{  3,  7, 10, 12,  3,  3, 19 },
		/* Permanent vulnerability */
		{  4,  8,  4, 13,  4,  4, 20 },
		/* Permanent immunity */
		{  5,  5,  5,  5,  5,  5,  5 },
		/* Unknown permanent effect */
		{  0,  0,  0,  0,  0,  0,  0 },
		/* No value for permanent effect */
		{  1,  1,  1,  1,  1,  1,  1 },
		/* Permanent resistance + permanent vulnerability */
		{ 14, 15, 16, 17, 14, 14, 21 }
	};
	struct loc p = details->value_position;
	int color_offset = (details->alternate_color_first) ? 22 : 0;
	struct ui_entry_combiner_funcs combiner;
	int vc, ac;
	int i;

	/* Check for defaults that are too short in list-ui-entry-renders.h. */
	assert(info->ncolors >= 44 && info->nlabcolors >= 13 &&
		info->nsym >= 22);

	for (i = 0; i < n; ++i) {
		int untimed_effect = convert_vanilla_res_level(vals[i]);
		int timed_effect = convert_vanilla_res_level(auxvals[i]);
		int palette_index;

		assert(untimed_effect >= 0 && untimed_effect < 7 &&
			timed_effect >= 0 && timed_effect < 7);
		palette_index =
			combined_effect_tbl[untimed_effect][timed_effect];
		Term_putch(p.x, p.y,
			info->colors[palette_index + color_offset],
			info->symbols[palette_index]);
		p = loc_sum(p, details->position_step);
		color_offset ^= 22;
	}

	if (nlabel <= 0 && !details->show_combined) {
		return;
	}

	if (ui_entry_combiner_get_funcs(info->combiner_index, &combiner)) {
		assert(0);
	}
	(*combiner.vec_func)(n, vals, auxvals, &vc, &ac);

	if (nlabel > 0) {
		const int combined_label_tbl[7][7] = {
			/* No permanent effect */
			{ 1, 5, 8, 10, 1, 1, 1 },
			/* Permanent resistance */
			{ 2, 6, 9, 11, 2, 2, 2 },
			/* Permanent vulnerability */
			{ 3, 7, 3, 12, 3, 3, 3 },
			/* Permanent immunity */
			{ 4, 4, 4,  4, 4, 4, 4 },
			/* Unknown permanent effect */
			{ 1, 5, 8, 10, 1, 1, 1 },
			/* No value for permanent effect */
			{ 1, 5, 8, 10, 1, 1, 1 },
			/* Permanent resistance + permanent vulnerability */
			{ 1, 5, 8, 10, 1, 1, 1 }
		};
		int palette_index;

		if (details->known_rune) {
			int untimed_effect = convert_vanilla_res_level(vc);
			int timed_effect = convert_vanilla_res_level(ac);

			assert(untimed_effect >= 0 && untimed_effect < 7 &&
				timed_effect >= 0 && timed_effect < 7);
			palette_index =
				combined_label_tbl[untimed_effect][timed_effect];
		} else {
			palette_index = 0;
		}

		if (details->vertical_label) {
			p = details->label_position;
			for (i = 0; i < nlabel; ++i) {
				Term_putch(p.x, p.y,
					info->label_colors[palette_index],
					label[i]);
				p.y += 1;
			}
		} else {
			safe_queue_chars(details->label_position.x,
				details->label_position.y, nlabel,
				info->label_colors[palette_index], label);
		}
	}

	if (details->show_combined) {
		show_combined_generic(info, details, vc, ac);
	}
}